

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MesmerizeOptions.cpp
# Opt level: O0

MesmerizeOptions *
MesmerizeOptions::FromArgs(MesmerizeOptions *__return_storage_ptr__,int argc,char **argv)

{
  char *__s;
  int iVar1;
  long lVar2;
  runtime_error *prVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int local_1a8;
  int local_1a4;
  int panPercentage;
  int zoomPercentage;
  int durationInSeconds_3;
  int durationInSeconds_2;
  int durationInSeconds_1;
  int durationInSeconds;
  string resYstr;
  string resXstr;
  string local_130 [32];
  string local_110 [32];
  undefined1 local_f0 [8];
  string optionValue;
  string optionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string arg;
  int i;
  allocator<char> local_49;
  string local_48 [8];
  string path;
  char **argv_local;
  int argc_local;
  MesmerizeOptions *options;
  
  path.field_2._M_local_buf[0xf] = '\0';
  MesmerizeOptions(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
  std::allocator<char>::~allocator(&local_49);
  arg.field_2._8_4_ = 1;
  do {
    if (argc <= (int)arg.field_2._8_4_) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Path to root picture folder missing");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->PathToPicturesFolder,local_48);
      path.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::~string(local_48);
      if ((path.field_2._M_local_buf[0xf] & 1U) == 0) {
        ~MesmerizeOptions(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    __s = argv[(int)arg.field_2._8_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,__s,&local_81);
    std::allocator<char>::~allocator(&local_81);
    lVar2 = std::__cxx11::string::find(local_80,0x163cce);
    if (lVar2 == -1) {
      iVar1 = std::__cxx11::string::compare((char *)local_48);
      if (iVar1 != 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_a8,"Invalid arg ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::runtime_error::runtime_error(prVar3,(string *)&local_a8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=(local_48,(string *)local_80);
    }
    else {
      std::__cxx11::string::string((string *)(optionValue.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_f0);
      lVar2 = std::__cxx11::string::find(local_80,0x163cde);
      if (lVar2 == -1) {
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_80);
        std::__cxx11::string::operator=((string *)(optionValue.field_2._M_local_buf + 8),local_110);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::operator=((string *)local_f0,"");
      }
      else {
        std::__cxx11::string::find(local_80,0x163cde);
        std::__cxx11::string::substr((ulong)local_130,(ulong)local_80);
        std::__cxx11::string::operator=((string *)(optionValue.field_2._M_local_buf + 8),local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::find(local_80,0x163cde);
        std::__cxx11::string::substr((ulong)((long)&resXstr.field_2 + 8),(ulong)local_80);
        std::__cxx11::string::operator=
                  ((string *)local_f0,(string *)(resXstr.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(resXstr.field_2._M_local_buf + 8));
      }
      iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
      if (iVar1 == 0) {
        __return_storage_ptr__->IsFullScreen = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
        if (iVar1 == 0) {
          __return_storage_ptr__->IsFullScreen = false;
        }
        else {
          iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
          if (iVar1 == 0) {
            lVar2 = std::__cxx11::string::find(local_f0,0x163cf7);
            if (lVar2 == 0) {
              __return_storage_ptr__->IsResolutionSetToMax = true;
              __return_storage_ptr__->ResolutionX = -1;
              __return_storage_ptr__->ResolutionY = -1;
            }
            else {
              lVar2 = std::__cxx11::string::find(local_f0,0x163cf9);
              if (lVar2 == -1) {
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar3,
                           "resolution option value is using an incorrect format, correct format is widthxheight"
                          );
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              std::__cxx11::string::find(local_f0,0x163cf9);
              std::__cxx11::string::substr((ulong)((long)&resYstr.field_2 + 8),(ulong)local_f0);
              std::__cxx11::string::find(local_f0,0x163cf9);
              std::__cxx11::string::substr((ulong)&durationInSeconds_1,(ulong)local_f0);
              __return_storage_ptr__->IsResolutionSetToMax = false;
              iVar1 = std::__cxx11::stoi((string *)((long)&resYstr.field_2 + 8),(size_t *)0x0,10);
              __return_storage_ptr__->ResolutionX = iVar1;
              iVar1 = std::__cxx11::stoi((string *)&durationInSeconds_1,(size_t *)0x0,10);
              __return_storage_ptr__->ResolutionY = iVar1;
              std::__cxx11::string::~string((string *)&durationInSeconds_1);
              std::__cxx11::string::~string((string *)(resYstr.field_2._M_local_buf + 8));
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
            if (iVar1 == 0) {
              durationInSeconds_2 = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
              __return_storage_ptr__->DisplayPictureDuration = durationInSeconds_2 * 1000;
            }
            else {
              iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
              if (iVar1 == 0) {
                durationInSeconds_3 = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
                __return_storage_ptr__->OpacityAnimationDuration = durationInSeconds_3 * 1000;
              }
              else {
                iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
                if (iVar1 == 0) {
                  zoomPercentage = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
                  __return_storage_ptr__->ZoomAnimationDuration = zoomPercentage * 1000;
                }
                else {
                  iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
                  if (iVar1 == 0) {
                    panPercentage = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
                    __return_storage_ptr__->PanAnimationDuration = panPercentage * 1000;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
                    if (iVar1 == 0) {
                      local_1a4 = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
                      __return_storage_ptr__->ZoomPercentage = (float)local_1a4 / 100.0;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare(optionValue.field_2._M_local_buf + 8);
                      if (iVar1 != 0) {
                        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::operator+(&local_1c8,"Unknown option: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&optionValue.field_2 + 8));
                        std::runtime_error::runtime_error(prVar3,(string *)&local_1c8);
                        __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      local_1a8 = std::__cxx11::stoi((string *)local_f0,(size_t *)0x0,10);
                      __return_storage_ptr__->PanPercentage = (float)local_1a8 / 100.0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)(optionValue.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_80);
    arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
  } while( true );
}

Assistant:

MesmerizeOptions MesmerizeOptions::FromArgs(int argc, const char** argv) {
    MesmerizeOptions options;
    std::string path = "";
    for(int i = 1; i < argc; i++) {
        std::string arg(argv[i]);
        if (arg.find("--") == std::string::npos) {
            if (path.compare("") != 0)
                throw std::runtime_error("Invalid arg " + arg);

            path = arg; //we assume that the non-option (no --) is the path
        }else{
            std::string optionName;
            std::string optionValue;

            if (arg.find("=") == std::string::npos) {
                optionName = arg.substr(2);
                optionValue = "";
            } else {
                optionName = arg.substr(2, arg.find("=") - 2);
                optionValue = arg.substr(arg.find("=") + 1);
            }
            if (!optionName.compare("full-screen")){
                options.IsFullScreen = true;
            }else if (!optionName.compare("window")){
                options.IsFullScreen = false;
            }else if (!optionName.compare("resolution")) {
                if (optionValue.find("max") == 0) {
                    options.IsResolutionSetToMax = true;
                    options.ResolutionX = -1;
                    options.ResolutionY = -1;
                } else {
                    if (optionValue.find("x") == std::string::npos)
                        throw std::runtime_error(
                                "resolution option value is using an incorrect format, correct format is widthxheight");
                    std::string resXstr = optionValue.substr(0, optionValue.find("x"));
                    std::string resYstr = optionValue.substr(optionValue.find("x") + 1);
                    options.IsResolutionSetToMax = false;
                    options.ResolutionX = std::stoi(resXstr);
                    options.ResolutionY = std::stoi(resYstr);
                }
            }else if (!optionName.compare("display-picture-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.DisplayPictureDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("opacity-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.OpacityAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.ZoomAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("pan-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.PanAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-percentage")) {
                int zoomPercentage = std::stoi(optionValue);
                options.ZoomPercentage = zoomPercentage / 100.0f;
            }else if (!optionName.compare("pan-percentage")) {
                int panPercentage = std::stoi(optionValue);
                options.PanPercentage = panPercentage / 100.0f;
            }else {
                throw std::runtime_error("Unknown option: " + optionName);
            }
        }
    }



    if (path.empty()){
        throw std::runtime_error("Path to root picture folder missing");
    }else {
        options.PathToPicturesFolder = path;
    }
    return options;
}